

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::NewDB(DBImpl *this)

{
  bool bVar1;
  undefined1 uVar2;
  string *dbname;
  uint64_t in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  Status *s;
  WritableFile *file;
  string record;
  Writer log;
  string manifest;
  VersionEdit new_db;
  DBImpl *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  VersionEdit *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  uint in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  Writer *in_stack_fffffffffffffe90;
  undefined1 local_158 [16];
  undefined1 local_148 [32];
  long *local_128 [11];
  undefined1 local_d0 [200];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  VersionEdit::VersionEdit(in_stack_fffffffffffffe48);
  dbname = (string *)user_comparator(in_stack_fffffffffffffe18);
  (**(_func_int **)((long)(dbname->_M_dataplus)._M_p + 0x18))();
  Slice::Slice((Slice *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
               (char *)in_stack_fffffffffffffe20);
  VersionEdit::SetComparatorName
            ((VersionEdit *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (Slice *)in_stack_fffffffffffffe20);
  VersionEdit::SetLogNumber((VersionEdit *)in_stack_fffffffffffffe18,0xd0d905);
  VersionEdit::SetNextFile((VersionEdit *)in_stack_fffffffffffffe18,0xd0d919);
  VersionEdit::SetLastSequence((VersionEdit *)in_stack_fffffffffffffe18,0xd0d92c);
  DescriptorFileName(in_stack_fffffffffffffe30,
                     CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  in_stack_fffffffffffffe88 = in_stack_fffffffffffffe88 & 0xffffff;
  (**(code **)(**(long **)(in_RSI + 8) + 0x20))(in_RDI,*(long **)(in_RSI + 8),local_d0,local_128);
  bVar1 = Status::ok((Status *)in_stack_fffffffffffffe18);
  if (bVar1) {
    leveldb::log::Writer::Writer((Writer *)in_stack_fffffffffffffe18,(WritableFile *)0xd0da02);
    std::__cxx11::string::string(in_stack_fffffffffffffe30);
    VersionEdit::EncodeTo
              ((VersionEdit *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (string *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    Slice::Slice((Slice *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 in_stack_fffffffffffffe20);
    leveldb::log::Writer::AddRecord
              (in_stack_fffffffffffffe90,
               (Slice *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    Status::operator=((Status *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                      (Status *)in_stack_fffffffffffffe20);
    Status::~Status((Status *)in_stack_fffffffffffffe18);
    bVar1 = Status::ok((Status *)in_stack_fffffffffffffe18);
    if (bVar1) {
      (**(code **)(*local_128[0] + 0x18))(local_148);
      Status::operator=((Status *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                        (Status *)in_stack_fffffffffffffe20);
      Status::~Status((Status *)in_stack_fffffffffffffe18);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe18);
    leveldb::log::Writer::~Writer((Writer *)in_stack_fffffffffffffe18);
    if (local_128[0] != (long *)0x0) {
      (**(code **)(*local_128[0] + 8))();
    }
    uVar2 = Status::ok((Status *)in_stack_fffffffffffffe18);
    if ((bool)uVar2) {
      SetCurrentFile((Env *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),dbname,
                     in_RSI);
      Status::operator=((Status *)CONCAT17(uVar2,in_stack_fffffffffffffe28),
                        (Status *)in_stack_fffffffffffffe20);
      Status::~Status((Status *)in_stack_fffffffffffffe18);
    }
    else {
      (**(code **)(**(long **)(in_RSI + 8) + 0x40))(local_158,*(long **)(in_RSI + 8),local_d0);
      Status::~Status((Status *)in_stack_fffffffffffffe18);
    }
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe18);
  VersionEdit::~VersionEdit((VersionEdit *)in_stack_fffffffffffffe18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status DBImpl::NewDB() {
  VersionEdit new_db;
  new_db.SetComparatorName(user_comparator()->Name());
  new_db.SetLogNumber(0);
  new_db.SetNextFile(2);
  new_db.SetLastSequence(0);

  const std::string manifest = DescriptorFileName(dbname_, 1);
  WritableFile* file;
  Status s = env_->NewWritableFile(manifest, &file);
  if (!s.ok()) {
    return s;
  }
  {
    log::Writer log(file);
    std::string record;
    new_db.EncodeTo(&record);
    s = log.AddRecord(record);
    if (s.ok()) {
      s = file->Close();
    }
  }
  delete file;
  if (s.ok()) {
    // Make "CURRENT" file that points to the new manifest file.
    s = SetCurrentFile(env_, dbname_, 1);
  } else {
    env_->DeleteFile(manifest);
  }
  return s;
}